

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_is_this_a_copy(char *urltype)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  cVar1 = *urltype;
  if (((cVar1 != 'm') || (urltype[1] != 'e')) || (iVar3 = 1, urltype[2] != 'm')) {
    iVar2 = strncmp(urltype,"compress",8);
    iVar3 = 1;
    if (iVar2 != 0) {
      iVar2 = strncmp(urltype,"http",4);
      if ((iVar2 != 0) && (((cVar1 != 'f' || (urltype[1] != 't')) || (urltype[2] != 'p')))) {
        iVar2 = strncmp(urltype,"gsiftp",6);
        if (iVar2 != 0) {
          builtin_strncpy(urltype,"stdin",5);
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int fits_is_this_a_copy(char *urltype) /* I - type of file */
/*
  specialized routine that returns 1 if the file is known to be a temporary
  copy of the originally opened file.  Otherwise it returns 0.
*/
{
  int iscopy;

  if (!strncmp(urltype, "mem", 3) )
     iscopy = 1;    /* file copy is in memory */
  else if (!strncmp(urltype, "compress", 8) )
     iscopy = 1;    /* compressed diskfile that is uncompressed in memory */
  else if (!strncmp(urltype, "http", 4) )
     iscopy = 1;    /* copied file using http protocol */
  else if (!strncmp(urltype, "ftp", 3) )
     iscopy = 1;    /* copied file using ftp protocol */
  else if (!strncmp(urltype, "gsiftp", 6) )
     iscopy = 1;    /* copied file using gsiftp protocol */
  else if (!strncpy(urltype, "stdin", 5) )
     iscopy = 1;    /* piped stdin has been copied to memory */
  else
     iscopy = 0;    /* file is not known to be a copy */
 
    return(iscopy);
}